

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeDelete(BtCursor *pCur)

{
  u8 uVar1;
  u8 uVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  MemPage *pPage;
  BtShared *pBt;
  u8 *puVar6;
  short sVar7;
  u16 uVar8;
  int iVar9;
  ulong uVar10;
  int local_64;
  MemPage *local_60;
  BtShared *local_58;
  Pgno local_50;
  u16 szCell;
  ulong local_48;
  u8 *local_40;
  int local_34;
  
  sVar3 = pCur->iPage;
  uVar4 = pCur->aiIdx[sVar3];
  pPage = pCur->apPage[sVar3];
  iVar9 = 1;
  if ((uVar4 < pPage->nCell) && (pCur->eState == '\x01')) {
    local_60 = (MemPage *)pCur->pBtree;
    pBt = *(BtShared **)&local_60->max1bytePayload;
    uVar5 = pPage->maskPage;
    uVar1 = pPage->aCellIdx[(ulong)uVar4 * 2];
    uVar2 = pPage->aCellIdx[(ulong)uVar4 * 2 + 1];
    puVar6 = pPage->aData;
    if (((pPage->leaf != '\0') || (iVar9 = sqlite3BtreePrevious(pCur,&local_34), iVar9 == 0)) &&
       (iVar9 = saveAllCursors(pBt,pCur->pgnoRoot,pCur), iVar9 == 0)) {
      local_58 = pBt;
      if (pCur->pKeyInfo == (KeyInfo *)0x0) {
        invalidateIncrblobCursors((Btree *)local_60,(pCur->info).nKey,0);
      }
      iVar9 = sqlite3PagerWrite(pPage->pDbPage);
      if (iVar9 == 0) {
        local_64 = clearCell(pPage,puVar6 + (CONCAT11(uVar1,uVar2) & uVar5),&szCell);
        dropCell(pPage,(uint)uVar4,(uint)szCell,&local_64);
        iVar9 = local_64;
        if (local_64 == 0) {
          if (pPage->leaf == '\0') {
            local_60 = pCur->apPage[pCur->iPage];
            local_50 = pCur->apPage[(long)sVar3 + 1]->pgno;
            local_40 = local_60->aData;
            uVar10 = (ulong)(CONCAT11(local_60->aCellIdx[(ulong)local_60->nCell * 2 + -2],
                                      local_60->aCellIdx[(ulong)local_60->nCell * 2 + -1]) &
                            local_60->maskPage);
            uVar8 = cellSizePtr(local_60,local_40 + uVar10);
            local_48 = (ulong)uVar8;
            local_58 = (BtShared *)local_58->pTmpSpace;
            local_64 = sqlite3PagerWrite(local_60->pDbPage);
            iVar9 = (int)local_48;
            insertCell(pPage,(uint)uVar4,local_40 + (uVar10 - 4),iVar9 + 4,(u8 *)local_58,local_50,
                       &local_64);
            dropCell(local_60,local_60->nCell - 1,iVar9,&local_64);
            if (local_64 != 0) {
              return local_64;
            }
          }
          iVar9 = balance(pCur);
          if (iVar9 == 0) {
            sVar7 = pCur->iPage;
            if (sVar3 < sVar7) {
              while (sVar3 < sVar7) {
                pCur->iPage = sVar7 + -1;
                releasePage(pCur->apPage[sVar7]);
                sVar7 = pCur->iPage;
              }
              iVar9 = balance(pCur);
              if (iVar9 != 0) {
                return iVar9;
              }
            }
            moveToRoot(pCur);
            iVar9 = 0;
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;              
  int rc;                              /* Return code */
  MemPage *pPage;                      /* Page to delete cell from */
  unsigned char *pCell;                /* Pointer to cell to delete */
  int iCellIdx;                        /* Index of cell to delete */
  int iCellDepth;                      /* Depth of node containing pCell */ 
  u16 szCell;                          /* Size of the cell being deleted */

  assert( cursorHoldsMutex(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );

  if( NEVER(pCur->aiIdx[pCur->iPage]>=pCur->apPage[pCur->iPage]->nCell) 
   || NEVER(pCur->eState!=CURSOR_VALID)
  ){
    return SQLITE_ERROR;  /* Something has gone awry. */
  }

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->aiIdx[iCellDepth];
  pPage = pCur->apPage[iCellDepth];
  pCell = findCell(pPage, iCellIdx);

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    int notUsed = 0;
    rc = sqlite3BtreePrevious(pCur, &notUsed);
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications. Make the page containing the entry to be 
  ** deleted writable. Then free any overflow pages associated with the 
  ** entry and finally remove the cell itself from within the page.  
  */
  rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
  if( rc ) return rc;

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 ){
    invalidateIncrblobCursors(p, pCur->info.nKey, 0);
  }

  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  rc = clearCell(pPage, pCell, &szCell);
  dropCell(pPage, iCellIdx, szCell, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->apPage[pCur->iPage];
    int nCell;
    Pgno n = pCur->apPage[iCellDepth+1]->pgno;
    unsigned char *pTmp;

    pCell = findCell(pLeaf, pLeaf->nCell-1);
    nCell = cellSizePtr(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as 
  ** well.  */
  rc = balance(pCur);
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    moveToRoot(pCur);
  }
  return rc;
}